

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.hpp
# Opt level: O2

Vector3<double> *
OpenMD::cross<double>
          (Vector3<double> *__return_storage_ptr__,Vector3<double> *v1,Vector3<double> *v2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>);
  dVar1 = (v2->super_Vector<double,_3U>).data_[0];
  dVar2 = (v1->super_Vector<double,_3U>).data_[0];
  dVar3 = (v1->super_Vector<double,_3U>).data_[1];
  dVar4 = (v1->super_Vector<double,_3U>).data_[2];
  dVar5 = (v2->super_Vector<double,_3U>).data_[1];
  dVar6 = (v2->super_Vector<double,_3U>).data_[2];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = dVar6 * dVar3 - dVar4 * dVar5;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = dVar1 * dVar4 - dVar2 * dVar6;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = dVar2 * dVar5 - dVar1 * dVar3;
  return __return_storage_ptr__;
}

Assistant:

inline Vector3<Real> cross(const Vector3<Real>& v1, const Vector3<Real>& v2) {
    Vector3<Real> result;

    result.x() = v1.y() * v2.z() - v1.z() * v2.y();
    result.y() = v1.z() * v2.x() - v1.x() * v2.z();
    result.z() = v1.x() * v2.y() - v1.y() * v2.x();

    return result;
  }